

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreevent.h
# Opt level: O2

void __thiscall QComboBoxPrivateScroller::timerEvent(QComboBoxPrivateScroller *this,QTimerEvent *e)

{
  if (*(TimerId *)(e + 0x10) == (this->timer).m_id) {
    doScroll(this,this->sliderAction);
    if (this->fast == true) {
      doScroll(this,this->sliderAction);
      doScroll(this,this->sliderAction);
      return;
    }
  }
  return;
}

Assistant:

Qt::TimerId id() const { return m_id; }